

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined8 *puVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  __m256i alVar5;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  int iVar6;
  int iVar7;
  uint uVar8;
  parasail_result_t *ppVar9;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  undefined8 uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  __m256i *palVar19;
  ulong uVar20;
  __m256i *__return_storage_ptr__;
  ulong uVar21;
  char *__format;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  ulong size;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  __m256i_64_t e;
  __m256i_64_t h;
  long local_290;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  ulong local_200;
  ulong uStack_1f8;
  ulong uStack_1f0;
  ulong uStack_1e8;
  undefined1 local_1e0 [32];
  longlong local_a0 [4];
  longlong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "profile";
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "profile->profile64.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "profile->matrix";
      }
      else {
        uVar12 = profile->s1Len;
        if ((int)uVar12 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar16 = "s2";
        }
        else {
          uVar25 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar16 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar16 = "open";
          }
          else {
            if (-1 < gap) {
              uVar26 = uVar12 - 1;
              size = (ulong)uVar12 + 3 >> 2;
              uVar15 = uVar26 / size;
              uVar17 = (uint)((ulong)uVar26 % size);
              uVar20 = CONCAT44(0,open);
              iVar11 = -open;
              iVar27 = ppVar3->min;
              uVar24 = 0x8000000000000000 - (long)iVar27;
              if (iVar27 != iVar11 && SBORROW4(iVar27,iVar11) == iVar27 + open < 0) {
                uVar24 = uVar20 | 0x8000000000000000;
              }
              iVar27 = ppVar3->max;
              ppVar9 = parasail_result_new_table1((uint)((ulong)uVar12 + 3) & 0x7ffffffc,s2Len);
              if (ppVar9 != (parasail_result_t *)0x0) {
                ppVar9->flag = ppVar9->flag | 0x4820401;
                ptr = parasail_memalign___m256i(0x20,size);
                __return_storage_ptr__ = (__m256i *)(ulong)(s2Len + 1);
                ptr_00 = parasail_memalign_int64_t(0x20,(size_t)__return_storage_ptr__);
                ptr_01 = parasail_memalign___m256i(0x20,size);
                ptr_02 = parasail_memalign___m256i(0x20,size);
                ptr_03 = parasail_memalign___m256i(0x20,size);
                if (ptr_03 != (__m256i *)0x0 &&
                    ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                    (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
                  iVar6 = s2Len + -1;
                  iVar7 = 3 - (int)uVar15;
                  auVar30._8_4_ = open;
                  auVar30._0_8_ = uVar20;
                  auVar30._12_4_ = 0;
                  auVar30._16_4_ = open;
                  auVar30._20_4_ = 0;
                  auVar30._24_4_ = open;
                  auVar30._28_4_ = 0;
                  uVar15 = CONCAT44(0,gap);
                  auVar31._8_4_ = gap;
                  auVar31._0_8_ = uVar15;
                  auVar31._12_4_ = 0;
                  auVar31._16_4_ = gap;
                  auVar31._20_4_ = 0;
                  auVar31._24_4_ = gap;
                  auVar31._28_4_ = 0;
                  uVar24 = uVar24 + 1;
                  lVar18 = 0x7ffffffffffffffe - (long)iVar27;
                  lVar13 = (long)-(gap * (int)size);
                  auVar32._8_8_ = lVar13;
                  auVar32._0_8_ = lVar13;
                  auVar32._16_8_ = lVar13;
                  auVar32._24_8_ = lVar13;
                  auVar32 = vpblendd_avx2(auVar32,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
                  auVar32 = vpaddq_avx2(ZEXT832(uVar24),auVar32);
                  lVar14 = (long)iVar11;
                  lVar13 = lVar14;
                  for (uVar21 = 0; uVar21 != size; uVar21 = uVar21 + 1) {
                    lVar22 = lVar13;
                    for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
                      local_80[lVar23] = lVar22;
                      local_a0[lVar23] = lVar22 - uVar20;
                      lVar22 = lVar22 - size * uVar15;
                    }
                    palVar19 = ptr_02 + uVar21;
                    (*palVar19)[0] = local_80[0];
                    (*palVar19)[1] = local_80[1];
                    (*palVar19)[2] = local_80[2];
                    (*palVar19)[3] = local_80[3];
                    palVar19 = ptr + uVar21;
                    (*palVar19)[0] = local_a0[0];
                    (*palVar19)[1] = local_a0[1];
                    (*palVar19)[2] = local_a0[2];
                    (*palVar19)[3] = local_a0[3];
                    lVar13 = lVar13 - uVar15;
                  }
                  *ptr_00 = 0;
                  for (palVar19 = (__m256i *)0x1; __return_storage_ptr__ != palVar19;
                      palVar19 = (__m256i *)((long)*palVar19 + 1)) {
                    ptr_00[(long)palVar19] = lVar14;
                    lVar14 = lVar14 - uVar15;
                  }
                  alVar5 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar30);
                  uVar8 = (int)size - 1;
                  for (uVar12 = uVar8; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
                    ptr_03[uVar12] = alVar5;
                    alVar5 = (__m256i)vpsubq_avx2((undefined1  [32])alVar5,auVar31);
                  }
                  lVar14 = size << 5;
                  lVar13 = size * uVar25;
                  local_290 = 0;
                  uVar15 = 0;
                  local_1e0._8_8_ = lVar18;
                  local_1e0._0_8_ = lVar18;
                  local_1e0._16_8_ = lVar18;
                  local_1e0._24_8_ = lVar18;
                  local_200 = uVar24;
                  uStack_1f8 = uVar24;
                  uStack_1f0 = uVar24;
                  uStack_1e8 = uVar24;
                  while (uVar15 != uVar25) {
                    alVar5 = ptr_02[uVar8];
                    auVar29 = alVar5._0_16_;
                    auVar37._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar29;
                    auVar37._16_16_ = ZEXT116(0) * alVar5._16_16_ + ZEXT116(1) * auVar29;
                    auVar37 = vpalignr_avx2((undefined1  [32])alVar5,auVar37,8);
                    auVar35 = vpblendd_avx2(auVar37,ZEXT832((ulong)ptr_00[uVar15]),3);
                    iVar27 = ppVar3->mapper[(byte)s2[uVar15]];
                    iVar11 = (int)size;
                    local_280._8_8_ = uVar24;
                    local_280._0_8_ = uVar24;
                    local_280._16_8_ = uVar24;
                    local_280._24_8_ = uVar24;
                    auVar37 = vpsubq_avx2(local_280,(undefined1  [32])*ptr_03);
                    for (lVar22 = 0; lVar14 != lVar22; lVar22 = lVar22 + 0x20) {
                      auVar34 = *(undefined1 (*) [32])((long)*ptr_02 + lVar22);
                      auVar33 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar22),auVar31);
                      vpsubq_avx2(auVar34,auVar30);
                      vpaddq_avx2(auVar35,*(undefined1 (*) [32])
                                           ((long)pvVar2 + lVar22 + (long)(iVar27 * iVar11) * 0x20))
                      ;
                      alVar5[1] = (longlong)ptr_03;
                      alVar5[0] = (longlong)ptr_00;
                      alVar5[2] = (longlong)ptr;
                      alVar5[3] = uVar15;
                      b[1]._0_4_ = iVar7;
                      b[0] = (longlong)ppVar9;
                      b[1]._4_4_ = iVar6;
                      b[2]._0_4_ = uVar26;
                      b[2]._4_4_ = uVar17;
                      b[3] = size;
                      palVar19 = ptr;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,alVar5,b);
                      vpaddq_avx2(auVar37,*(undefined1 (*) [32])((long)*ptr_03 + lVar22));
                      a[1] = (longlong)ptr_03;
                      a[0] = (longlong)ptr_00;
                      a[2] = (longlong)palVar19;
                      a[3] = uVar15;
                      b_00[1]._0_4_ = iVar7;
                      b_00[0] = (longlong)ppVar9;
                      b_00[1]._4_4_ = iVar6;
                      b_00[2]._0_4_ = uVar26;
                      b_00[2]._4_4_ = uVar17;
                      b_00[3] = size;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a,b_00);
                      a_00[1] = (longlong)ptr_03;
                      a_00[0] = (longlong)ptr_00;
                      a_00[2] = (longlong)palVar19;
                      a_00[3] = uVar15;
                      b_01[1]._0_4_ = iVar7;
                      b_01[0] = (longlong)ppVar9;
                      b_01[1]._4_4_ = iVar6;
                      b_01[2]._0_4_ = uVar26;
                      b_01[2]._4_4_ = uVar17;
                      b_01[3] = size;
                      auVar37 = auVar33;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_01);
                      local_260._0_8_ = auVar33._0_8_;
                      local_260._8_8_ = auVar33._8_8_;
                      local_260._16_8_ = auVar33._16_8_;
                      local_260._24_8_ = auVar33._24_8_;
                      puVar1 = (undefined8 *)((long)*ptr + lVar22);
                      *puVar1 = local_260._0_8_;
                      puVar1[1] = local_260._8_8_;
                      puVar1[2] = local_260._16_8_;
                      puVar1[3] = local_260._24_8_;
                      *(undefined1 (*) [32])((long)*ptr_01 + lVar22) = auVar37;
                      auVar35 = auVar34;
                      ptr = palVar19;
                    }
                    auVar37 = vpermq_avx2(auVar37,0x90);
                    lVar22 = uVar15 + 1;
                    uVar15 = uVar15 + 1;
                    auVar37 = vpblendd_avx2(auVar37,ZEXT832((ulong)ptr_00[lVar22]),3);
                    vpaddq_avx2(auVar37,(undefined1  [32])*ptr_03);
                    auVar36 = ZEXT3264(local_280);
                    a_01[1] = (longlong)ptr_03;
                    a_01[0] = (longlong)ptr_00;
                    a_01[2] = (longlong)ptr;
                    a_01[3] = uVar15;
                    b_02[1]._0_4_ = iVar7;
                    b_02[0] = (longlong)ppVar9;
                    b_02[1]._4_4_ = iVar6;
                    b_02[2]._0_4_ = uVar26;
                    b_02[2]._4_4_ = uVar17;
                    b_02[3] = size;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_02);
                    iVar27 = 2;
                    while( true ) {
                      auVar34 = auVar36._0_32_;
                      auVar35 = vperm2i128_avx2(auVar34,auVar34,8);
                      auVar35 = vpalignr_avx2(auVar34,auVar35,8);
                      bVar28 = iVar27 == 0;
                      iVar27 = iVar27 + -1;
                      if (bVar28) break;
                      vpaddq_avx2(auVar35,auVar32);
                      a_02[1] = (longlong)ptr_03;
                      a_02[0] = (longlong)ptr_00;
                      a_02[2] = (longlong)ptr;
                      a_02[3] = uVar15;
                      b_03[1]._0_4_ = iVar7;
                      b_03[0] = (longlong)ppVar9;
                      b_03[1]._4_4_ = iVar6;
                      b_03[2]._0_4_ = uVar26;
                      b_03[2]._4_4_ = uVar17;
                      b_03[3] = size;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_02,b_03);
                    }
                    local_260 = vpaddq_avx2(auVar35,ZEXT832(uVar24));
                    a_03[1] = (longlong)ptr_03;
                    a_03[0] = (longlong)ptr_00;
                    a_03[2] = (longlong)ptr;
                    a_03[3] = uVar15;
                    b_04[1]._0_4_ = iVar7;
                    b_04[0] = (longlong)ppVar9;
                    b_04[1]._4_4_ = iVar6;
                    b_04[2]._0_4_ = uVar26;
                    b_04[2]._4_4_ = uVar17;
                    b_04[3] = size;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_03,b_04);
                    lVar22 = local_290;
                    for (lVar23 = 0; lVar14 != lVar23; lVar23 = lVar23 + 0x20) {
                      auVar35 = *(undefined1 (*) [32])((long)*ptr_01 + lVar23);
                      local_260 = vpsubq_avx2(local_260,auVar31);
                      vpsubq_avx2(auVar37,auVar30);
                      a_04[1] = (longlong)ptr_03;
                      a_04[0] = (longlong)ptr_00;
                      a_04[2] = (longlong)ptr;
                      a_04[3] = uVar15;
                      b_05[1]._0_4_ = iVar7;
                      b_05[0] = (longlong)ppVar9;
                      b_05[1]._4_4_ = iVar6;
                      b_05[2]._0_4_ = uVar26;
                      b_05[2]._4_4_ = uVar17;
                      b_05[3] = size;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_05);
                      a_05[1] = (longlong)ptr_03;
                      a_05[0] = (longlong)ptr_00;
                      a_05[2] = (longlong)ptr;
                      a_05[3] = uVar15;
                      b_06[1]._0_4_ = iVar7;
                      b_06[0] = (longlong)ppVar9;
                      b_06[1]._4_4_ = iVar6;
                      b_06[2]._0_4_ = uVar26;
                      b_06[2]._4_4_ = uVar17;
                      b_06[3] = size;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_06);
                      *(undefined1 (*) [32])((long)*ptr_02 + lVar23) = auVar35;
                      auVar37 = vpcmpgtq_avx2(auVar35,local_1e0);
                      local_1e0 = vblendvpd_avx(auVar35,local_1e0,auVar37);
                      a_06[1] = (longlong)ptr_03;
                      a_06[0] = (longlong)ptr_00;
                      a_06[2] = (longlong)ptr;
                      a_06[3] = uVar15;
                      b_07[1]._0_4_ = iVar7;
                      b_07[0] = (longlong)ppVar9;
                      b_07[1]._4_4_ = iVar6;
                      b_07[2]._0_4_ = uVar26;
                      b_07[2]._4_4_ = uVar17;
                      b_07[3] = size;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_07);
                      piVar4 = ((ppVar9->field_4).rowcols)->score_row;
                      *(int *)((long)piVar4 + lVar22) = auVar35._0_4_;
                      *(int *)((long)piVar4 + lVar13 * 4 + lVar22) = auVar35._8_4_;
                      *(int *)((long)piVar4 + lVar13 * 8 + lVar22) = auVar35._16_4_;
                      *(int *)((long)piVar4 + lVar13 * 0xc + lVar22) = auVar35._24_4_;
                      lVar22 = lVar22 + uVar25 * 4;
                      auVar37 = auVar35;
                    }
                    local_290 = local_290 + 4;
                  }
                  alVar5 = ptr_02[uVar17];
                  for (iVar27 = 0; iVar27 < iVar7; iVar27 = iVar27 + 1) {
                    auVar32 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                    alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar32,8);
                  }
                  auVar34._8_8_ = uVar24;
                  auVar34._0_8_ = uVar24;
                  auVar34._16_8_ = uVar24;
                  auVar34._24_8_ = uVar24;
                  auVar32 = vpcmpgtq_avx2(auVar34,local_1e0);
                  auVar35._8_8_ = uStack_1f8;
                  auVar35._0_8_ = local_200;
                  auVar35._16_8_ = uStack_1f0;
                  auVar35._24_8_ = uStack_1e8;
                  auVar33._8_8_ = lVar18;
                  auVar33._0_8_ = lVar18;
                  auVar33._16_8_ = lVar18;
                  auVar33._24_8_ = lVar18;
                  auVar30 = vpcmpgtq_avx2(auVar35,auVar33);
                  auVar32 = vpor_avx2(auVar30,auVar32);
                  if ((((auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       SUB321(auVar32 >> 0x7f,0) == '\0') && SUB321(auVar32 >> 0xbf,0) == '\0') &&
                      -1 < auVar32[0x1f]) {
                    uVar10 = vpextrq_avx(alVar5._16_16_,1);
                    iVar27 = (int)uVar10;
                  }
                  else {
                    *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                    iVar27 = 0;
                    iVar6 = 0;
                    uVar26 = 0;
                  }
                  ppVar9->score = iVar27;
                  ppVar9->end_query = uVar26;
                  ppVar9->end_ref = iVar6;
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  return ppVar9;
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar16 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_scan_profile_avx2_256_64",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}